

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  bool bVar2;
  level_type lVar3;
  int iVar4;
  shared_ptr *psVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  char *pcVar8;
  weak_ptr *pwVar9;
  file *this;
  element_type *peVar10;
  long *plVar11;
  long lVar12;
  exception *e;
  ostringstream oss_27;
  ostringstream oss_26;
  ostringstream oss_25;
  string line;
  ostringstream oss_24;
  ifstream ifs;
  shared_ptr<booster::log::sinks::file> f;
  ostringstream oss_23;
  ostringstream oss_22;
  ostringstream oss_21;
  ostringstream oss_20;
  ostringstream oss_19;
  ostringstream oss_18;
  ostringstream oss_17;
  ostringstream oss_16;
  ostringstream oss_15;
  ostringstream oss_14;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  shared_ptr<booster::log::sink> s;
  file *in_stack_ffffffffffffc3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc400;
  string local_3470 [32];
  ostringstream local_3450 [383];
  undefined1 local_32d1;
  string local_32d0 [32];
  ostringstream local_32b0 [383];
  undefined1 local_3131;
  string local_3130 [32];
  ostringstream local_3110 [376];
  string local_2f98 [39];
  undefined1 local_2f71;
  string local_2f70 [32];
  ostringstream local_2f50 [376];
  istream local_2dd8 [527];
  byte local_2bc9;
  message local_2bc8 [71];
  allocator local_2b81;
  string local_2b80 [55];
  undefined1 local_2b49;
  string local_2b48 [32];
  ostringstream local_2b28 [383];
  byte local_29a9;
  message local_29a8 [55];
  undefined1 local_2971;
  string local_2970 [32];
  ostringstream local_2950 [383];
  byte local_27d1;
  message local_27d0 [55];
  undefined1 local_2799;
  string local_2798 [32];
  ostringstream local_2778 [383];
  byte local_25f9;
  message local_25f8 [71];
  undefined1 local_25b1;
  string local_25b0 [32];
  ostringstream local_2590 [383];
  undefined1 local_2411;
  string local_2410 [32];
  ostringstream local_23f0 [383];
  byte local_2271;
  message local_2270 [55];
  undefined1 local_2239;
  string local_2238 [32];
  ostringstream local_2218 [383];
  byte local_2099;
  message local_2098 [55];
  undefined1 local_2061;
  string local_2060 [32];
  ostringstream local_2040 [383];
  byte local_1ec1;
  message local_1ec0 [55];
  undefined1 local_1e89;
  string local_1e88 [32];
  ostringstream local_1e68 [383];
  byte local_1ce9;
  message local_1ce8 [55];
  undefined1 local_1cb1;
  string local_1cb0 [32];
  ostringstream local_1c90 [383];
  byte local_1b11;
  message local_1b10 [55];
  undefined1 local_1ad9;
  string local_1ad8 [32];
  ostringstream local_1ab8 [383];
  byte local_1939;
  message local_1938 [55];
  undefined1 local_1901;
  string local_1900 [32];
  ostringstream local_18e0 [383];
  byte local_1761;
  message local_1760 [55];
  undefined1 local_1729;
  string local_1728 [32];
  ostringstream local_1708 [383];
  byte local_1589;
  message local_1588 [55];
  undefined1 local_1551;
  string local_1550 [32];
  ostringstream local_1530 [383];
  byte local_13b1;
  message local_13b0 [55];
  undefined1 local_1379;
  string local_1378 [32];
  ostringstream local_1358 [383];
  byte local_11d9;
  message local_11d8 [55];
  undefined1 local_11a1;
  string local_11a0 [32];
  ostringstream local_1180 [383];
  byte local_1001;
  message local_1000 [55];
  undefined1 local_fc9;
  string local_fc8 [32];
  ostringstream local_fa8 [383];
  byte local_e29;
  message local_e28 [55];
  undefined1 local_df1;
  string local_df0 [32];
  ostringstream local_dd0 [383];
  undefined1 local_c51;
  string local_c50 [32];
  ostringstream local_c30 [383];
  byte local_ab1;
  message local_ab0 [55];
  undefined1 local_a79;
  string local_a78 [32];
  ostringstream local_a58 [383];
  undefined1 local_8d9;
  string local_8d8 [32];
  ostringstream local_8b8 [383];
  byte local_739;
  message local_738 [55];
  undefined1 local_701;
  string local_700 [32];
  ostringstream local_6e0 [383];
  undefined1 local_561;
  string local_560 [32];
  ostringstream local_540 [383];
  allocator local_3c1;
  string local_3c0 [39];
  undefined1 local_399;
  string local_398 [32];
  ostringstream local_378 [383];
  undefined1 local_1f9;
  string local_1f8 [32];
  ostringstream local_1d8 [383];
  byte local_59;
  message local_58 [84];
  undefined4 local_4;
  
  local_4 = 0;
  operator_new(8);
  my_sink::my_sink((my_sink *)in_stack_ffffffffffffc400);
  std::shared_ptr<booster::log::sink>::shared_ptr<my_sink,void>
            ((shared_ptr<booster::log::sink> *)in_stack_ffffffffffffc400,
             (my_sink *)in_stack_ffffffffffffc3f8);
  psVar5 = (shared_ptr *)booster::log::logger::instance();
  booster::log::logger::add_sink(psVar5);
  reset();
  local_59 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x0);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_58,emergency,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x2b);
    local_59 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"Test");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_59 & 1) != 0) {
    booster::log::message::~message(local_58);
  }
  if ((called & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    poVar6 = std::operator<<((ostream *)local_1d8,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2c);
    std::operator<<(poVar6," called");
    local_1f9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1f8);
    local_1f9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = std::operator==(in_stack_ffffffffffffc400,(char *)in_stack_ffffffffffffc3f8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_378);
    poVar6 = std::operator<<((ostream *)local_378,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2d);
    std::operator<<(poVar6," last_message == \"Test\"");
    local_399 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_398);
    local_399 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"test",&local_3c1);
  bVar2 = std::operator==((char *)in_stack_ffffffffffffc400,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffc3f8);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_540);
    poVar6 = std::operator<<((ostream *)local_540,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2e);
    std::operator<<(poVar6," last_module==std::string(\"test\")");
    local_561 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_560);
    local_561 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (last_level != emergency) {
    std::__cxx11::ostringstream::ostringstream(local_6e0);
    poVar6 = std::operator<<((ostream *)local_6e0,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2f);
    std::operator<<(poVar6," last_level ==bl::emergency");
    local_701 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_700);
    local_701 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  local_739 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0xa);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_738,alert,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x31);
    local_739 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_739 & 1) != 0) {
    booster::log::message::~message(local_738);
  }
  if ((called & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    poVar6 = std::operator<<((ostream *)local_8b8,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x32);
    std::operator<<(poVar6," called");
    local_8d9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_8d8);
    local_8d9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (last_level != alert) {
    std::__cxx11::ostringstream::ostringstream(local_a58);
    poVar6 = std::operator<<((ostream *)local_a58,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x33);
    std::operator<<(poVar6," last_level==bl::alert");
    local_a79 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_a78);
    local_a79 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  local_ab1 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_ab0,error,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x35);
    local_ab1 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_ab1 & 1) != 0) {
    booster::log::message::~message(local_ab0);
  }
  if ((called & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_c30);
    poVar6 = std::operator<<((ostream *)local_c30,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x36);
    std::operator<<(poVar6," called");
    local_c51 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_c50);
    local_c51 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (last_level != error) {
    std::__cxx11::ostringstream::ostringstream(local_dd0);
    poVar6 = std::operator<<((ostream *)local_dd0,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x37);
    std::operator<<(poVar6," last_level==bl::error");
    local_df1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_df0);
    local_df1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  local_e29 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_e28,warning,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x39);
    local_e29 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_e29 & 1) != 0) {
    booster::log::message::~message(local_e28);
  }
  if ((called & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_fa8);
    poVar6 = std::operator<<((ostream *)local_fa8,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x3a);
    std::operator<<(poVar6," !called");
    local_fc9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_fc8);
    local_fc9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  local_1001 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_1000,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x3c);
    local_1001 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_1001 & 1) != 0) {
    booster::log::message::~message(local_1000);
  }
  if ((called & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1180);
    poVar6 = std::operator<<((ostream *)local_1180,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x3d);
    std::operator<<(poVar6," !called");
    local_11a1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_11a0);
    local_11a1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  local_11d9 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x46);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_11d8,debug,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x3f);
    local_11d9 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_11d9 & 1) != 0) {
    booster::log::message::~message(local_11d8);
  }
  if ((called & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1358);
    poVar6 = std::operator<<((ostream *)local_1358,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x40);
    std::operator<<(poVar6," !called");
    local_1379 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1378);
    local_1379 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_default_level(lVar3);
  local_13b1 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_13b0,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x43);
    local_13b1 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_13b1 & 1) != 0) {
    booster::log::message::~message(local_13b0);
  }
  if ((called & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1530);
    poVar6 = std::operator<<((ostream *)local_1530,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x44);
    std::operator<<(poVar6," called");
    local_1551 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1550);
    local_1551 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  local_1589 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x3c);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_1588,info,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x46);
    local_1589 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_1589 & 1) != 0) {
    booster::log::message::~message(local_1588);
  }
  if ((called & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1708);
    poVar6 = std::operator<<((ostream *)local_1708,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x47);
    std::operator<<(poVar6," !called");
    local_1729 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1728);
    local_1729 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_log_level(lVar3,(char *)0x1e);
  local_1761 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_1760,error,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x4a);
    local_1761 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_1761 & 1) != 0) {
    booster::log::message::~message(local_1760);
  }
  if ((called & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_18e0);
    poVar6 = std::operator<<((ostream *)local_18e0,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x4b);
    std::operator<<(poVar6," called");
    local_1901 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1900);
    local_1901 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  local_1939 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_1938,warning,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x4d);
    local_1939 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_1939 & 1) != 0) {
    booster::log::message::~message(local_1938);
  }
  if ((called & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1ab8);
    poVar6 = std::operator<<((ostream *)local_1ab8,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x4e);
    std::operator<<(poVar6," !called");
    local_1ad9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1ad8);
    local_1ad9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_log_level(lVar3,(char *)0x28);
  local_1b11 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_1b10,warning,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x51);
    local_1b11 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_1b11 & 1) != 0) {
    booster::log::message::~message(local_1b10);
  }
  if ((called & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1c90);
    poVar6 = std::operator<<((ostream *)local_1c90,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x52);
    std::operator<<(poVar6," called");
    local_1cb1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1cb0);
    local_1cb1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  local_1ce9 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_1ce8,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x54);
    local_1ce9 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_1ce9 & 1) != 0) {
    booster::log::message::~message(local_1ce8);
  }
  if ((called & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1e68);
    poVar6 = std::operator<<((ostream *)local_1e68,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x55);
    std::operator<<(poVar6," !called");
    local_1e89 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_1e88);
    local_1e89 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  pcVar8 = (char *)booster::log::logger::instance();
  booster::log::logger::reset_log_level(pcVar8);
  local_1ec1 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_1ec0,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x58);
    local_1ec1 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_1ec1 & 1) != 0) {
    booster::log::message::~message(local_1ec0);
  }
  if ((called & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_2040);
    poVar6 = std::operator<<((ostream *)local_2040,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x59);
    std::operator<<(poVar6," called");
    local_2061 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_2060);
    local_2061 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  reset();
  local_2099 = 0;
  lVar3 = booster::log::logger::instance();
  bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x3c);
  if ((bVar1 & 1) != 0) {
    booster::log::message::message
              (local_2098,info,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x5b);
    local_2099 = 1;
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"x");
    std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
  }
  if ((local_2099 & 1) != 0) {
    booster::log::message::~message(local_2098);
  }
  if ((called & 1U) == 0) {
    reset();
    local_2271 = 0;
    lVar3 = booster::log::logger::instance();
    bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x3c);
    if ((bVar1 & 1) != 0) {
      booster::log::message::message
                (local_2270,info,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x5e);
      local_2271 = 1;
      poVar6 = (ostream *)booster::log::message::out();
      iVar4 = never_called();
      plVar11 = (long *)std::ostream::operator<<(poVar6,iVar4);
      std::ios::operator_cast_to_bool((ios *)((long)plVar11 + *(long *)(*plVar11 + -0x18)));
    }
    if ((local_2271 & 1) != 0) {
      booster::log::message::~message(local_2270);
    }
    if ((called & 1U) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_23f0);
      poVar6 = std::operator<<((ostream *)local_23f0,"Error ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5f);
      std::operator<<(poVar6," !called");
      local_2411 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_2410);
      local_2411 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((never_called_called & 1U) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_2590);
      poVar6 = std::operator<<((ostream *)local_2590,"Error ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x60);
      std::operator<<(poVar6," !never_called_called");
      local_25b1 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_25b0);
      local_25b1 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    reset();
    pwVar9 = (weak_ptr *)booster::log::logger::instance();
    std::weak_ptr<booster::log::sink>::weak_ptr<booster::log::sink,void>
              ((weak_ptr<booster::log::sink> *)in_stack_ffffffffffffc400,
               (shared_ptr<booster::log::sink> *)in_stack_ffffffffffffc3f8);
    booster::log::logger::remove_sink(pwVar9);
    std::weak_ptr<booster::log::sink>::~weak_ptr((weak_ptr<booster::log::sink> *)0x10896d);
    local_25f9 = 0;
    lVar3 = booster::log::logger::instance();
    bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if ((bVar1 & 1) != 0) {
      booster::log::message::message
                (local_25f8,error,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,99);
      local_25f9 = 1;
      poVar6 = (ostream *)booster::log::message::out();
      poVar6 = std::operator<<(poVar6,"message");
      std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
    }
    if ((local_25f9 & 1) != 0) {
      booster::log::message::~message(local_25f8);
    }
    if ((called & 1U) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_2778);
      poVar6 = std::operator<<((ostream *)local_2778,"Error ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,100);
      std::operator<<(poVar6," !called");
      local_2799 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_2798);
      local_2799 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    reset();
    psVar5 = (shared_ptr *)booster::log::logger::instance();
    booster::log::logger::add_sink(psVar5);
    local_27d1 = 0;
    lVar3 = booster::log::logger::instance();
    bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if ((bVar1 & 1) != 0) {
      booster::log::message::message
                (local_27d0,error,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x67);
      local_27d1 = 1;
      poVar6 = (ostream *)booster::log::message::out();
      poVar6 = std::operator<<(poVar6,"message");
      std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
    }
    if ((local_27d1 & 1) != 0) {
      booster::log::message::~message(local_27d0);
    }
    if ((called & 1U) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_2950);
      poVar6 = std::operator<<((ostream *)local_2950,"Error ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x68);
      std::operator<<(poVar6," called");
      local_2971 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar7,local_2970);
      local_2971 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    reset();
    booster::log::logger::instance();
    booster::log::logger::remove_all_sinks();
    local_29a9 = 0;
    lVar3 = booster::log::logger::instance();
    bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if ((bVar1 & 1) != 0) {
      booster::log::message::message
                (local_29a8,error,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6b);
      local_29a9 = 1;
      poVar6 = (ostream *)booster::log::message::out();
      poVar6 = std::operator<<(poVar6,"message");
      std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
    }
    if ((local_29a9 & 1) != 0) {
      booster::log::message::~message(local_29a8);
    }
    if ((called & 1U) == 0) {
      reset();
      this = (file *)operator_new(0x30);
      booster::log::sinks::file::file(this);
      std::shared_ptr<booster::log::sinks::file>::shared_ptr<booster::log::sinks::file,void>
                ((shared_ptr<booster::log::sinks::file> *)in_stack_ffffffffffffc400,
                 in_stack_ffffffffffffc3f8);
      peVar10 = std::
                __shared_ptr_access<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x10922e);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b80,"test.log",&local_2b81);
      booster::log::sinks::file::open(peVar10,local_2b80);
      std::__cxx11::string::~string(local_2b80);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b81);
      psVar5 = (shared_ptr *)booster::log::logger::instance();
      std::shared_ptr<booster::log::sink>::shared_ptr<booster::log::sinks::file,void>
                ((shared_ptr<booster::log::sink> *)in_stack_ffffffffffffc400,
                 (shared_ptr<booster::log::sinks::file> *)in_stack_ffffffffffffc3f8);
      booster::log::logger::add_sink(psVar5);
      std::shared_ptr<booster::log::sink>::~shared_ptr((shared_ptr<booster::log::sink> *)0x1092ea);
      local_2bc9 = 0;
      lVar3 = booster::log::logger::instance();
      bVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
      if ((bVar1 & 1) != 0) {
        booster::log::message::message
                  (local_2bc8,error,"module",
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                   ,0x72);
        local_2bc9 = 1;
        poVar6 = (ostream *)booster::log::message::out();
        poVar6 = std::operator<<(poVar6,"Message ");
        plVar11 = (long *)std::ostream::operator<<(poVar6,3.14159);
        std::ios::operator_cast_to_bool((ios *)((long)plVar11 + *(long *)(*plVar11 + -0x18)));
      }
      if ((local_2bc9 & 1) != 0) {
        booster::log::message::~message(local_2bc8);
      }
      std::ifstream::ifstream(local_2dd8,"test.log",8);
      bVar1 = std::ios::good();
      if ((bVar1 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_2f50);
        poVar6 = std::operator<<((ostream *)local_2f50,"Error ");
        poVar6 = std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                                );
        poVar6 = std::operator<<(poVar6,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x74);
        std::operator<<(poVar6," ifs.good()");
        local_2f71 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar7,local_2f70);
        local_2f71 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string(local_2f98);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_2dd8,local_2f98);
      lVar12 = std::__cxx11::string::find((char *)local_2f98,0x10b15b);
      if (lVar12 == -1) {
        std::__cxx11::ostringstream::ostringstream(local_3110);
        poVar6 = std::operator<<((ostream *)local_3110,"Error ");
        poVar6 = std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                                );
        poVar6 = std::operator<<(poVar6,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x77);
        std::operator<<(poVar6," line.find(\"Message \")!=std::string::npos");
        local_3131 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar7,local_3130);
        local_3131 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar12 = std::__cxx11::string::find((char *)local_2f98,0x10b154);
      if (lVar12 == -1) {
        std::__cxx11::ostringstream::ostringstream(local_32b0);
        poVar6 = std::operator<<((ostream *)local_32b0,"Error ");
        poVar6 = std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                                );
        poVar6 = std::operator<<(poVar6,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x78);
        std::operator<<(poVar6," line.find(\"module\")!=std::string::npos");
        local_32d1 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar7,local_32d0);
        local_32d1 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar12 = std::__cxx11::string::find((char *)local_2f98,0x10b1c2);
      if (lVar12 == -1) {
        std::__cxx11::ostringstream::ostringstream(local_3450);
        poVar6 = std::operator<<((ostream *)local_3450,"Error ");
        poVar6 = std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                                );
        poVar6 = std::operator<<(poVar6,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x79);
        std::operator<<(poVar6," line.find(\"3.14159\")!=std::string::npos");
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar7,local_3470);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::~string(local_2f98);
      std::ifstream::~ifstream(local_2dd8);
      std::shared_ptr<booster::log::sinks::file>::~shared_ptr
                ((shared_ptr<booster::log::sinks::file> *)0x109bc4);
      std::shared_ptr<booster::log::sink>::~shared_ptr((shared_ptr<booster::log::sink> *)0x109bd1);
      poVar6 = std::operator<<((ostream *)&std::cout,"Ok");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream(local_2b28);
    poVar6 = std::operator<<((ostream *)local_2b28,"Error ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x6c);
    std::operator<<(poVar6," !called");
    local_2b49 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_2b48);
    local_2b49 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_2218);
  poVar6 = std::operator<<((ostream *)local_2218,"Error ");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                          );
  poVar6 = std::operator<<(poVar6,":");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5c);
  std::operator<<(poVar6," !called");
  local_2239 = 1;
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar7,local_2238);
  local_2239 = 0;
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		namespace bl = booster::log;
		booster::shared_ptr<bl::sink> s(new my_sink);
		bl::logger::instance().add_sink(s);
		reset();
		BOOSTER_EMERG("test") << "Test";
		TEST(called);
		TEST(last_message == "Test");
		TEST(last_module==std::string("test"));
		TEST(last_level ==bl::emergency);
		reset();
		BOOSTER_ALERT("test") << "x";
		TEST(called);
		TEST(last_level==bl::alert);
		reset();
		BOOSTER_ERROR("test") << "x";
		TEST(called);
		TEST(last_level==bl::error);
		reset();
		BOOSTER_WARNING("test") << "x";
		TEST(!called);
		reset();
		BOOSTER_NOTICE("test") << "x";
		TEST(!called);
		reset();
		BOOSTER_DEBUG("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().set_default_level(bl::notice);
		BOOSTER_NOTICE("test") << "x";
		TEST(called);
		reset();
		BOOSTER_INFO("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().set_log_level(bl::error,"test");
		BOOSTER_ERROR("test") << "x";
		TEST(called);
		reset();
		BOOSTER_WARNING("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().set_log_level(bl::warning,"test");
		BOOSTER_WARNING("test") << "x";
		TEST(called);
		reset();
		BOOSTER_NOTICE("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().reset_log_level("test");
		BOOSTER_NOTICE("test") << "x";
		TEST(called);
		reset();
		BOOSTER_INFO("test") << "x";
		TEST(!called);
		reset();
		BOOSTER_INFO("test") << never_called();
		TEST(!called);
		TEST(!never_called_called);
		reset();
		bl::logger::instance().remove_sink(s);
		BOOSTER_ERROR("test") << "message";
		TEST(!called);
		reset();
		bl::logger::instance().add_sink(s);
		BOOSTER_ERROR("test") << "message";
		TEST(called);
		reset();
		bl::logger::instance().remove_all_sinks();
		BOOSTER_ERROR("test") << "message";
		TEST(!called);
		reset();

		booster::shared_ptr<bl::sinks::file> f(new bl::sinks::file());
		f->open("test.log");
		bl::logger::instance().add_sink(f);
		BOOSTER_ERROR("module") << "Message " << 3.14159;
		std::ifstream ifs("test.log");
		TEST(ifs.good());
		std::string line;
		std::getline(ifs,line);
		TEST(line.find("Message ")!=std::string::npos);
		TEST(line.find("module")!=std::string::npos);
		TEST(line.find("3.14159")!=std::string::npos);
	}
	catch(std::exception const &e)
	{
		std::cerr << "Fail: " <<e.what() << std::endl;
		return 1;
	}
	
	std::cout << "Ok" << std::endl;

	return 0;
}